

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Osc::renderFMSin(V2Osc *this,float *dest,int nsamples)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float out;
  float t;
  float mod;
  int i;
  int nsamples_local;
  float *dest_local;
  V2Osc *this_local;
  
  for (t = 0.0; (int)t < nsamples; t = (float)((int)t + 1)) {
    fVar2 = dest[(int)t];
    fVar1 = utof23(this->cnt);
    this->cnt = this->freq + this->cnt;
    fVar3 = this->gain;
    fVar2 = fastsinrc((fVar1 + fVar2 * 2.0) * 6.2831855);
    fVar3 = fVar3 * fVar2;
    if ((this->ring & 1U) == 0) {
      dest[(int)t] = fVar3;
    }
    else {
      dest[(int)t] = fVar3 * dest[(int)t];
    }
  }
  return;
}

Assistant:

void renderFMSin(float *dest, int nsamples)
    {
        COVER("Osc FM");

        // V2's take on FM is a bit unconventional but fairly slick and flexible.
        // The carrier wave is always a sine, but the modulator is whatever happens
        // to be in the voice buffer at that point - which is the output of the
        // previous oscillators. So you can use all the oscillator waveforms
        // (including noise, other FMs and the aux bus oscillators!) as modulator
        // if you are so inclined.
        //
        // And it's very little code too :)
        for (int i=0; i < nsamples; i++)
        {
            float mod = dest[i] * fcfmmax;
            float t = (utof23(cnt) + mod) * fc2pi;
            cnt += freq;

            float out = gain * fastsinrc(t);
            if (ring)
                dest[i] *= out;
            else
                dest[i] = out;
        }
    }